

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::
TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
::TypedAttribute(TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                 *this)

{
  AttrMetas::AttrMetas(&this->_metas);
  this->_value_empty = false;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)&(this->_attrib).contained = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 8) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x18) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x30) = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 0x38) = 0;
  this->_blocked = false;
  return;
}

Assistant:

TypedAttribute() = default;